

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void putRGBAAseparate16bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *r,uchar *g,uchar *b,uchar *a)

{
  ushort *local_48;
  uint16_t *wa;
  uint16_t *wb;
  uint16_t *wg;
  uint16_t *wr;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  wg = (uint16_t *)r;
  wb = (uint16_t *)g;
  wa = (uint16_t *)b;
  local_48 = (ushort *)a;
  _y_local = cp;
  for (wr._0_4_ = h; (uint32_t)wr != 0; wr._0_4_ = (uint32_t)wr - 1) {
    for (w_local = 0; w_local < w; w_local = w_local + 1) {
      *_y_local = CONCAT13(img->Bitdepth16To8[*local_48],
                           CONCAT12(img->Bitdepth16To8[*wa],
                                    CONCAT11(img->Bitdepth16To8[*wb],img->Bitdepth16To8[*wg])));
      local_48 = local_48 + 1;
      wa = wa + 1;
      wb = wb + 1;
      wg = wg + 1;
      _y_local = _y_local + 1;
    }
    wg = wg + fromskew;
    wb = wb + fromskew;
    wa = wa + fromskew;
    local_48 = local_48 + fromskew;
    _y_local = _y_local + toskew;
  }
  return;
}

Assistant:

DECLARESepPutFunc(putRGBAAseparate16bittile)
{
    uint16_t *wr = (uint16_t *)r;
    uint16_t *wg = (uint16_t *)g;
    uint16_t *wb = (uint16_t *)b;
    uint16_t *wa = (uint16_t *)a;
    (void)img;
    (void)y;
    for (; h > 0; --h)
    {
        for (x = 0; x < w; x++)
            *cp++ = PACK4(img->Bitdepth16To8[*wr++], img->Bitdepth16To8[*wg++],
                          img->Bitdepth16To8[*wb++], img->Bitdepth16To8[*wa++]);
        SKEW4(wr, wg, wb, wa, fromskew);
        cp += toskew;
    }
}